

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void * __thiscall tetgenmesh::memorypool::alloc(memorypool *this)

{
  undefined8 *puVar1;
  uintptr_t alignptr;
  void **newblock;
  void *newitem;
  memorypool *this_local;
  
  if (this->deaditemstack == (void *)0x0) {
    if (this->unallocateditems == 0) {
      if (*this->nowblock == (void *)0x0) {
        puVar1 = (undefined8 *)
                 malloc((long)(this->itemsperblock * this->itembytes) + 8 + (long)this->alignbytes);
        if (puVar1 == (undefined8 *)0x0) {
          terminatetetgen((tetgenmesh *)0x0,1);
        }
        *this->nowblock = puVar1;
        *puVar1 = 0;
      }
      this->nowblock = (void **)*this->nowblock;
      this->nextitem =
           (void *)((long)(this->nowblock + 1) +
                   ((long)this->alignbytes -
                   (ulong)(this->nowblock + 1) % (ulong)(long)this->alignbytes));
      this->unallocateditems = this->itemsperblock;
    }
    newblock = (void **)this->nextitem;
    this->nextitem = (void *)((long)this->nextitem + (long)this->itembytes);
    this->unallocateditems = this->unallocateditems + -1;
    this->maxitems = this->maxitems + 1;
  }
  else {
    newblock = (void **)this->deaditemstack;
    this->deaditemstack = *this->deaditemstack;
  }
  this->items = this->items + 1;
  return newblock;
}

Assistant:

void* tetgenmesh::memorypool::alloc()
{
  void *newitem;
  void **newblock;
  uintptr_t alignptr;

  // First check the linked list of dead items.  If the list is not 
  //   empty, allocate an item from the list rather than a fresh one.
  if (deaditemstack != (void *) NULL) {
    newitem = deaditemstack;                     // Take first item in list.
    deaditemstack = * (void **) deaditemstack;
  } else {
    // Check if there are any free items left in the current block.
    if (unallocateditems == 0) {
      // Check if another block must be allocated.
      if (*nowblock == (void *) NULL) {
        // Allocate a new block of items, pointed to by the previous block.
        newblock = (void **) malloc(itemsperblock * itembytes + sizeof(void *) 
                                    + alignbytes);
        if (newblock == (void **) NULL) {
          terminatetetgen(NULL, 1);
        }
        *nowblock = (void *) newblock;
        // The next block pointer is NULL.
        *newblock = (void *) NULL;
      }
      // Move to the new block.
      nowblock = (void **) *nowblock;
      // Find the first item in the block.
      //   Increment by the size of (void *).
      alignptr = (uintptr_t) (nowblock + 1);
      // Align the item on an `alignbytes'-byte boundary.
      nextitem = (void *)
        (alignptr + (uintptr_t) alignbytes -
         (alignptr % (uintptr_t) alignbytes));
      // There are lots of unallocated items left in this block.
      unallocateditems = itemsperblock;
    }
    // Allocate a new item.
    newitem = nextitem;
    // Advance `nextitem' pointer to next free item in block.
    nextitem = (void *) ((uintptr_t) nextitem + itembytes);
    unallocateditems--;
    maxitems++;
  }
  items++;
  return newitem;
}